

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall psy::C::Parser::Parser(Parser *this,SyntaxTree *tree)

{
  MemoryPool *pMVar1;
  allocator_type local_13;
  key_equal local_12;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11;
  
  pMVar1 = SyntaxTree::unitPool(tree);
  this->pool_ = pMVar1;
  this->tree_ = tree;
  this->backtracker_ = (Backtracker *)0x0;
  (this->diagReporter_).parser_ = this;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->diagReporter_).IDsForDelay_._M_h,0,&local_11,&local_12,&local_13);
  (this->diagReporter_).retainedAmbiguityDiags_.
  super__Vector_base<std::tuple<psy::DiagnosticDescriptor,_unsigned_long,_const_psy::C::SyntaxNode_*>,_std::allocator<std::tuple<psy::DiagnosticDescriptor,_unsigned_long,_const_psy::C::SyntaxNode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->diagReporter_).retainedAmbiguityDiags_.
  super__Vector_base<std::tuple<psy::DiagnosticDescriptor,_unsigned_long,_const_psy::C::SyntaxNode_*>,_std::allocator<std::tuple<psy::DiagnosticDescriptor,_unsigned_long,_const_psy::C::SyntaxNode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->diagReporter_).delayedDiags_.
  super__Vector_base<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->diagReporter_).retainedAmbiguityDiags_.
  super__Vector_base<std::tuple<psy::DiagnosticDescriptor,_unsigned_long,_const_psy::C::SyntaxNode_*>,_std::allocator<std::tuple<psy::DiagnosticDescriptor,_unsigned_long,_const_psy::C::SyntaxNode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->diagReporter_).delayedDiags_.
  super__Vector_base<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->diagReporter_).delayedDiags_.
  super__Vector_base<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->curTkIdx_ = 1;
  this->isWithinKandRFuncDef_ = false;
  this->DEPTH_OF_EXPRS_ = 0;
  this->DEPTH_OF_STMTS_ = 0;
  return;
}

Assistant:

Parser::Parser(SyntaxTree* tree)
    : pool_(tree->unitPool())
    , tree_(tree)
    , backtracker_(nullptr)
    , diagReporter_(this)
    , curTkIdx_(1)
    , isWithinKandRFuncDef_(false)
    , DEPTH_OF_EXPRS_(0)
    , DEPTH_OF_STMTS_(0)
{
    depth_ = 0;
}